

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

bool JSON::checkSchemaInternal
               (JSON_value *this_v,JSON_value *sch_v,unsigned_long flags,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *errors,string *prefix)

{
  __uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> _Var1;
  __uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> this_v_00;
  pointer pcVar2;
  JSON_value *sch_v_00;
  JSON_value *pJVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  mapped_type *pmVar11;
  _Rb_tree_node_base *p_Var12;
  undefined8 *puVar13;
  _List_node_base *p_Var14;
  const_iterator cVar15;
  _Base_ptr p_Var16;
  _List_node_base *p_Var17;
  size_type *psVar18;
  ulong uVar19;
  ulong uVar20;
  uint __val;
  char cVar21;
  _Base_ptr p_Var22;
  undefined1 auVar23 [8];
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  *p_Var26;
  uint __len;
  JSON_value *pJVar27;
  bool bVar28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_5;
  string err_prefix;
  string pattern_key;
  undefined1 local_1b8 [8];
  _List_node_base *local_1b0;
  _List_node_base local_1a8;
  size_t local_190;
  _List_node_base *local_188;
  ulong local_180;
  _List_node_base local_178;
  JSON_value *local_168;
  _List_node_base *local_160;
  _List_node_base *local_158;
  uint local_150;
  undefined4 uStack_14c;
  _List_node_base local_148;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
  *local_138;
  string *local_130;
  unsigned_long local_128;
  undefined1 *local_120;
  long local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  _Base_ptr local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  _Base_ptr local_58;
  string local_50;
  
  local_160 = (_List_node_base *)errors;
  local_130 = prefix;
  local_128 = flags;
  if (this_v == (JSON_value *)0x0) {
    lVar7 = 0;
    local_168 = (JSON_value *)0x0;
  }
  else {
    lVar7 = __dynamic_cast(this_v,&JSON_value::typeinfo,&JSON_array::typeinfo,0);
    local_168 = (JSON_value *)
                __dynamic_cast(this_v,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
  }
  if (sch_v == (JSON_value *)0x0) {
    bVar28 = true;
    lVar8 = 0;
    local_138 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                 *)0x0;
  }
  else {
    local_138 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                 *)__dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_array::typeinfo,0);
    lVar8 = __dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_dictionary::typeinfo,0);
    lVar9 = __dynamic_cast(sch_v,&JSON_value::typeinfo,&JSON_string::typeinfo,0);
    bVar28 = lVar9 == 0;
  }
  local_120 = &local_110;
  local_118 = 0;
  local_110 = 0;
  if (local_130->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_120,0,(char *)0x0,0x25d944);
  }
  else {
    std::operator+(&local_100,"json key \"",local_130);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_100);
    p_Var14 = (_List_node_base *)(plVar10 + 2);
    if ((_List_node_base *)*plVar10 == p_Var14) {
      local_1a8._M_next = p_Var14->_M_next;
      local_1a8._M_prev = (_List_node_base *)plVar10[3];
      local_1b8 = (undefined1  [8])&local_1a8;
    }
    else {
      local_1a8._M_next = p_Var14->_M_next;
      local_1b8 = (undefined1  [8])*plVar10;
    }
    local_1b0 = (_List_node_base *)plVar10[1];
    *plVar10 = (long)p_Var14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_120,(string *)local_1b8);
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8._M_next)->_M_next + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                               local_100.field_2._M_local_buf[0]) + 1);
    }
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  if (lVar8 == 0) {
    if (local_138 ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
         *)0x0) {
      if (bVar28) {
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1b8,local_120,local_120 + local_118);
        std::__cxx11::string::append(local_1b8);
        p_Var14 = (_List_node_base *)operator_new(0x30);
        p_Var17 = p_Var14 + 2;
        p_Var14[1]._M_next = p_Var17;
        if (local_1b8 == (undefined1  [8])&local_1a8) goto LAB_00122d8a;
        goto LAB_001227f9;
      }
    }
    else {
      p_Var22 = (local_138->_M_impl).super__Rb_tree_header._M_header._M_parent;
      lVar8 = (long)(local_138->_M_impl).super__Rb_tree_header._M_header._M_left - (long)p_Var22;
      if (lVar8 != 0x10) {
        if (lVar7 != 0) {
          p_Var16 = *(_Base_ptr *)(lVar7 + 0x10);
          p_Var25 = *(_Base_ptr *)(lVar7 + 0x18);
          if ((long)p_Var25 - (long)p_Var16 == lVar8) {
            if (p_Var16 != p_Var25) {
              uVar19 = 0;
              p_Var26 = local_138;
              local_e0 = p_Var25;
              do {
                p_Var22 = (p_Var26->_M_impl).super__Rb_tree_header._M_header._M_parent;
                if ((ulong)((long)(p_Var26->_M_impl).super__Rb_tree_header._M_header._M_left -
                            (long)p_Var22 >> 4) <= uVar19) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar19);
                }
                local_168 = (JSON_value *)**(undefined8 **)p_Var16;
                pJVar27 = (JSON_value *)**(undefined8 **)(&p_Var22->_M_color + uVar19 * 4);
                local_1b8 = (undefined1  [8])&local_1a8;
                pcVar2 = (local_130->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_1b8,pcVar2,pcVar2 + local_130->_M_string_length);
                std::__cxx11::string::append(local_1b8);
                cVar21 = '\x01';
                if (9 < uVar19) {
                  uVar20 = uVar19;
                  cVar5 = '\x04';
                  do {
                    cVar21 = cVar5;
                    if (uVar20 < 100) {
                      cVar21 = cVar21 + -2;
                      goto LAB_00122ed5;
                    }
                    if (uVar20 < 1000) {
                      cVar21 = cVar21 + -1;
                      goto LAB_00122ed5;
                    }
                    if (uVar20 < 10000) goto LAB_00122ed5;
                    bVar28 = 99999 < uVar20;
                    uVar20 = uVar20 / 10000;
                    cVar5 = cVar21 + '\x04';
                  } while (bVar28);
                  cVar21 = cVar21 + '\x01';
                }
LAB_00122ed5:
                local_188 = &local_178;
                std::__cxx11::string::_M_construct((ulong)&local_188,cVar21);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_188,(uint)local_180,uVar19);
                p_Var22 = (_Base_ptr)0xf;
                if (local_1b8 != (undefined1  [8])&local_1a8) {
                  p_Var22 = (_Base_ptr)local_1a8._M_next;
                }
                p_Var24 = (_Base_ptr)((long)&local_1b0->_M_next + local_180);
                if (p_Var22 < p_Var24) {
                  p_Var22 = (_Base_ptr)0xf;
                  if (local_188 != &local_178) {
                    p_Var22 = (_Base_ptr)local_178._M_next;
                  }
                  if (p_Var22 < p_Var24) goto LAB_00122f47;
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_188,0,(char *)0x0,(ulong)local_1b8);
                }
                else {
LAB_00122f47:
                  puVar13 = (undefined8 *)
                            std::__cxx11::string::_M_append(local_1b8,(ulong)local_188);
                }
                psVar18 = puVar13 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar13 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_d8.field_2._M_allocated_capacity = *psVar18;
                  local_d8.field_2._8_8_ = puVar13[3];
                  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                }
                else {
                  local_d8.field_2._M_allocated_capacity = *psVar18;
                  local_d8._M_dataplus._M_p = (pointer)*puVar13;
                }
                local_d8._M_string_length = puVar13[1];
                *puVar13 = psVar18;
                puVar13[1] = 0;
                *(undefined1 *)psVar18 = 0;
                checkSchemaInternal(local_168,pJVar27,local_128,
                                    (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_160,&local_d8);
                p_Var26 = local_138;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                if (local_188 != &local_178) {
                  operator_delete(local_188,(ulong)((long)&(local_178._M_next)->_M_next + 1));
                }
                if (local_1b8 != (undefined1  [8])&local_1a8) {
                  operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8._M_next)->_M_next + 1)
                                 );
                }
                uVar19 = uVar19 + 1;
                p_Var16 = (_Base_ptr)&p_Var16->_M_left;
              } while (p_Var16 != local_e0);
            }
            goto LAB_00123159;
          }
        }
        local_188 = &local_178;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,local_120,local_120 + local_118);
        std::__cxx11::string::append((char *)&local_188);
        uVar19 = lVar8 >> 4;
        cVar21 = '\x01';
        if (9 < uVar19) {
          uVar20 = uVar19;
          cVar5 = '\x04';
          do {
            cVar21 = cVar5;
            if (uVar20 < 100) {
              cVar21 = cVar21 + -2;
              goto LAB_00123178;
            }
            if (uVar20 < 1000) {
              cVar21 = cVar21 + -1;
              goto LAB_00123178;
            }
            if (uVar20 < 10000) goto LAB_00123178;
            bVar28 = 99999 < uVar20;
            uVar20 = uVar20 / 10000;
            cVar5 = cVar21 + '\x04';
          } while (bVar28);
          cVar21 = cVar21 + '\x01';
        }
LAB_00123178:
        local_158 = &local_148;
        std::__cxx11::string::_M_construct((ulong)&local_158,cVar21);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_158,local_150,uVar19);
        p_Var22 = (_Base_ptr)(CONCAT44(uStack_14c,local_150) + local_180);
        p_Var24 = (_Base_ptr)0xf;
        if (local_188 != &local_178) {
          p_Var24 = (_Base_ptr)local_178._M_next;
        }
        if (p_Var24 < p_Var22) {
          p_Var24 = (_Base_ptr)0xf;
          if (local_158 != &local_148) {
            p_Var24 = (_Base_ptr)local_148._M_next;
          }
          if (p_Var24 < p_Var22) goto LAB_001231e0;
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_158,0,(char *)0x0,(ulong)local_188);
        }
        else {
LAB_001231e0:
          plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_158);
        }
        local_1b8 = (undefined1  [8])&local_1a8;
        p_Var14 = (_List_node_base *)(plVar10 + 2);
        if ((_List_node_base *)*plVar10 == p_Var14) {
          local_1a8._M_next = p_Var14->_M_next;
          local_1a8._M_prev = (_List_node_base *)plVar10[3];
        }
        else {
          local_1a8._M_next = p_Var14->_M_next;
          local_1b8 = (undefined1  [8])*plVar10;
        }
        local_1b0 = (_List_node_base *)plVar10[1];
        *plVar10 = (long)p_Var14;
        plVar10[1] = 0;
        *(undefined1 *)&p_Var14->_M_next = 0;
        p_Var17 = (_List_node_base *)operator_new(0x30);
        p_Var14 = local_160;
        p_Var17[1]._M_next = p_Var17 + 2;
        if (local_1b8 == (undefined1  [8])&local_1a8) {
          p_Var17[2]._M_next = local_1a8._M_next;
          p_Var17[2]._M_prev = local_1a8._M_prev;
        }
        else {
          p_Var17[1]._M_next = (_List_node_base *)local_1b8;
          p_Var17[2]._M_next = local_1a8._M_next;
        }
        p_Var17[1]._M_prev = local_1b0;
        local_1b0 = (_List_node_base *)0x0;
        local_1a8._M_next = (_List_node_base *)((ulong)local_1a8._M_next & 0xffffffffffffff00);
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__detail::_List_node_base::_M_hook(p_Var17);
        p_Var14[1]._M_next = (_List_node_base *)((long)&(p_Var14[1]._M_next)->_M_next + 1);
        if (local_1b8 != (undefined1  [8])&local_1a8) {
          operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8._M_next)->_M_next + 1));
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,(ulong)((long)&(local_148._M_next)->_M_next + 1));
        }
        p_Var22 = (_Base_ptr)local_178._M_next;
        auVar23 = (undefined1  [8])local_188;
        if (local_188 != &local_178) goto LAB_001232ec;
        goto LAB_001232f4;
      }
      if (lVar7 == 0) {
        pJVar27 = (JSON_value *)**(undefined8 **)p_Var22;
        pcVar2 = (local_130->_M_dataplus)._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + local_130->_M_string_length);
        checkSchemaInternal(this_v,pJVar27,local_128,
                            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_160,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        pJVar27 = *(JSON_value **)(lVar7 + 0x10);
        local_168 = *(JSON_value **)(lVar7 + 0x18);
        if (pJVar27 != local_168) {
          __val = 0;
          p_Var26 = local_138;
          do {
            p_Var22 = (p_Var26->_M_impl).super__Rb_tree_header._M_header._M_parent;
            if ((p_Var26->_M_impl).super__Rb_tree_header._M_header._M_left == p_Var22) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
            }
            pJVar3 = (JSON_value *)
                     **(undefined8 **)&((_Rep_type *)&pJVar27->_vptr_JSON_value)->_M_impl;
            sch_v_00 = (JSON_value *)**(undefined8 **)p_Var22;
            pcVar2 = (local_130->_M_dataplus)._M_p;
            local_1b8 = (undefined1  [8])&local_1a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1b8,pcVar2,pcVar2 + local_130->_M_string_length);
            std::__cxx11::string::append(local_1b8);
            __len = 1;
            if (9 < __val) {
              uVar19 = (ulong)__val;
              uVar4 = 4;
              do {
                __len = uVar4;
                uVar6 = (uint)uVar19;
                if (uVar6 < 100) {
                  __len = __len - 2;
                  goto LAB_0012263b;
                }
                if (uVar6 < 1000) {
                  __len = __len - 1;
                  goto LAB_0012263b;
                }
                if (uVar6 < 10000) goto LAB_0012263b;
                uVar19 = uVar19 / 10000;
                uVar4 = __len + 4;
              } while (99999 < uVar6);
              __len = __len + 1;
            }
LAB_0012263b:
            local_188 = &local_178;
            std::__cxx11::string::_M_construct((ulong)&local_188,(char)__len);
            std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_188,__len,__val);
            p_Var22 = (_Base_ptr)0xf;
            if (local_1b8 != (undefined1  [8])&local_1a8) {
              p_Var22 = (_Base_ptr)local_1a8._M_next;
            }
            p_Var24 = (_Base_ptr)((long)&local_1b0->_M_next + local_180);
            if (p_Var22 < p_Var24) {
              p_Var22 = (_Base_ptr)0xf;
              if (local_188 != &local_178) {
                p_Var22 = (_Base_ptr)local_178._M_next;
              }
              if (p_Var22 < p_Var24) goto LAB_001226af;
              puVar13 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_188,0,(char *)0x0,(ulong)local_1b8);
            }
            else {
LAB_001226af:
              puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_1b8,(ulong)local_188);
            }
            psVar18 = puVar13 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar13 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_b8.field_2._M_allocated_capacity = *psVar18;
              local_b8.field_2._8_8_ = puVar13[3];
              local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            }
            else {
              local_b8.field_2._M_allocated_capacity = *psVar18;
              local_b8._M_dataplus._M_p = (pointer)*puVar13;
            }
            local_b8._M_string_length = puVar13[1];
            *puVar13 = psVar18;
            puVar13[1] = 0;
            *(undefined1 *)psVar18 = 0;
            checkSchemaInternal(pJVar3,sch_v_00,local_128,
                                (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_160,&local_b8);
            p_Var26 = local_138;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (local_188 != &local_178) {
              operator_delete(local_188,(ulong)((long)&(local_178._M_next)->_M_next + 1));
            }
            if (local_1b8 != (undefined1  [8])&local_1a8) {
              operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8._M_next)->_M_next + 1));
            }
            __val = __val + 1;
            pJVar27 = pJVar27 + 1;
          } while (pJVar27 != local_168);
        }
      }
    }
LAB_00123159:
    bVar28 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_160->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == local_160;
  }
  else {
    if (local_168 != (JSON_value *)0x0) {
      local_138 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                   *)(lVar8 + 0x10);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                  *)local_1b8,local_138);
      local_180 = 0;
      local_178._M_next = (_List_node_base *)((ulong)local_178._M_next & 0xffffffffffffff00);
      local_188 = &local_178;
      if (local_190 == 1) {
        std::__cxx11::string::_M_assign((string *)&local_188);
        if (((2 < local_180) && (*(char *)&local_188->_M_next == '<')) &&
           (*(char *)((long)local_188 + (local_180 - 1)) == '>')) {
          std::__cxx11::string::_M_assign((string *)&local_100);
        }
        if (local_188 != &local_178) {
          operator_delete(local_188,(ulong)((long)&(local_178._M_next)->_M_next + 1));
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                   *)local_1b8);
      if (local_100._M_string_length == 0) {
        p_Var16 = *(_Base_ptr *)(lVar8 + 0x28);
        p_Var25 = (_Base_ptr)(lVar8 + 0x18);
        if (p_Var16 != p_Var25) {
          pJVar27 = local_168 + 1;
          local_e0 = (_Base_ptr)&local_168[1].type_code;
          local_58 = p_Var25;
          do {
            cVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                             *)pJVar27,(key_type *)(p_Var16 + 1));
            if (cVar15._M_node == local_e0) {
              if ((local_128 & 1) == 0) {
                local_158 = &local_148;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_158,local_120,local_120 + local_118);
                std::__cxx11::string::append((char *)&local_158);
                plVar10 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_158,*(ulong *)(p_Var16 + 1));
                p_Var14 = (_List_node_base *)(plVar10 + 2);
                if ((_List_node_base *)*plVar10 == p_Var14) {
                  local_178._M_next = p_Var14->_M_next;
                  local_178._M_prev = (_List_node_base *)plVar10[3];
                  local_188 = &local_178;
                }
                else {
                  local_178._M_next = p_Var14->_M_next;
                  local_188 = (_List_node_base *)*plVar10;
                }
                local_180 = plVar10[1];
                *plVar10 = (long)p_Var14;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_188);
                local_1b8 = (undefined1  [8])&local_1a8;
                p_Var14 = (_List_node_base *)(plVar10 + 2);
                if ((_List_node_base *)*plVar10 == p_Var14) {
                  local_1a8._M_next = p_Var14->_M_next;
                  local_1a8._M_prev = (_List_node_base *)plVar10[3];
                }
                else {
                  local_1a8._M_next = p_Var14->_M_next;
                  local_1b8 = (undefined1  [8])*plVar10;
                }
                local_1b0 = (_List_node_base *)plVar10[1];
                *plVar10 = (long)p_Var14;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                p_Var17 = (_List_node_base *)operator_new(0x30);
                p_Var14 = local_160;
                p_Var17[1]._M_next = p_Var17 + 2;
                if (local_1b8 == (undefined1  [8])&local_1a8) {
                  p_Var17[2]._M_next = local_1a8._M_next;
                  p_Var17[2]._M_prev = local_1a8._M_prev;
                }
                else {
                  p_Var17[1]._M_next = (_List_node_base *)local_1b8;
                  p_Var17[2]._M_next = local_1a8._M_next;
                }
                p_Var17[1]._M_prev = local_1b0;
                local_1b0 = (_List_node_base *)0x0;
                local_1a8._M_next =
                     (_List_node_base *)((ulong)local_1a8._M_next & 0xffffffffffffff00);
                local_1b8 = (undefined1  [8])&local_1a8;
                std::__detail::_List_node_base::_M_hook(p_Var17);
                p_Var14[1]._M_next = (_List_node_base *)((long)p_Var14[1]._M_next + 1);
                if (local_1b8 != (undefined1  [8])&local_1a8) {
                  operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8._M_next)->_M_next + 1)
                                 );
                }
                if (local_188 != &local_178) {
                  operator_delete(local_188,(ulong)((long)&(local_178._M_next)->_M_next + 1));
                }
                p_Var22 = (_Base_ptr)local_148._M_next;
                auVar23 = (undefined1  [8])local_158;
                p_Var25 = local_58;
                if (local_158 != &local_148) goto LAB_00122b28;
              }
            }
            else {
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                                      *)pJVar27,(key_type *)(p_Var16 + 1));
              _Var1._M_t.
              super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
              super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
                   (((pmVar11->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->value)._M_t.
                   super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>.
                   _M_t;
              pJVar3 = (JSON_value *)**(undefined8 **)(p_Var16 + 2);
              local_1b8 = (undefined1  [8])&local_1a8;
              pcVar2 = (local_130->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_1b8,pcVar2,pcVar2 + local_130->_M_string_length);
              std::__cxx11::string::append(local_1b8);
              plVar10 = (long *)std::__cxx11::string::_M_append(local_1b8,*(ulong *)(p_Var16 + 1));
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              psVar18 = (size_type *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_98.field_2._M_allocated_capacity = *psVar18;
                local_98.field_2._8_8_ = plVar10[3];
              }
              else {
                local_98.field_2._M_allocated_capacity = *psVar18;
                local_98._M_dataplus._M_p = (pointer)*plVar10;
              }
              local_98._M_string_length = plVar10[1];
              *plVar10 = (long)psVar18;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              checkSchemaInternal((JSON_value *)
                                  _Var1._M_t.
                                  super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                                  .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,
                                  pJVar3,local_128,
                                  (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_160,&local_98);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1
                               );
              }
              p_Var22 = (_Base_ptr)local_1a8._M_next;
              auVar23 = local_1b8;
              if (local_1b8 != (undefined1  [8])&local_1a8) {
LAB_00122b28:
                operator_delete((void *)auVar23,(ulong)((long)&p_Var22->_M_color + 1));
              }
            }
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
          } while (p_Var16 != p_Var25);
        }
        p_Var12 = *(_Rb_tree_node_base **)&local_168[2].type_code;
        pJVar27 = local_168 + 1;
        if (p_Var12 != (_Rb_tree_node_base *)&pJVar27->type_code) {
          do {
            cVar15 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                     ::find(local_138,(key_type *)(p_Var12 + 1));
            if (cVar15._M_node == p_Var25) {
              local_158 = &local_148;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_158,local_120,local_120 + local_118);
              std::__cxx11::string::append((char *)&local_158);
              plVar10 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_158,*(ulong *)(p_Var12 + 1));
              p_Var14 = (_List_node_base *)(plVar10 + 2);
              if ((_List_node_base *)*plVar10 == p_Var14) {
                local_178._M_next = p_Var14->_M_next;
                local_178._M_prev = (_List_node_base *)plVar10[3];
                local_188 = &local_178;
              }
              else {
                local_178._M_next = p_Var14->_M_next;
                local_188 = (_List_node_base *)*plVar10;
              }
              local_180 = plVar10[1];
              *plVar10 = (long)p_Var14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append((char *)&local_188);
              p_Var14 = (_List_node_base *)(plVar10 + 2);
              if ((_List_node_base *)*plVar10 == p_Var14) {
                local_1a8._M_next = p_Var14->_M_next;
                local_1a8._M_prev = (_List_node_base *)plVar10[3];
                local_1b8 = (undefined1  [8])&local_1a8;
              }
              else {
                local_1a8._M_next = p_Var14->_M_next;
                local_1b8 = (undefined1  [8])*plVar10;
              }
              local_1b0 = (_List_node_base *)plVar10[1];
              *plVar10 = (long)p_Var14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              p_Var17 = (_List_node_base *)operator_new(0x30);
              p_Var14 = local_160;
              p_Var17[1]._M_next = p_Var17 + 2;
              if (local_1b8 == (undefined1  [8])&local_1a8) {
                p_Var17[2]._M_next = local_1a8._M_next;
                p_Var17[2]._M_prev = local_1a8._M_prev;
              }
              else {
                p_Var17[1]._M_next = (_List_node_base *)local_1b8;
                p_Var17[2]._M_next = local_1a8._M_next;
              }
              p_Var17[1]._M_prev = local_1b0;
              local_1b0 = (_List_node_base *)0x0;
              local_1a8._M_next = (_List_node_base *)((ulong)local_1a8._M_next & 0xffffffffffffff00)
              ;
              local_1b8 = (undefined1  [8])&local_1a8;
              std::__detail::_List_node_base::_M_hook(p_Var17);
              p_Var14[1]._M_next = (_List_node_base *)((long)p_Var14[1]._M_next + 1);
              if (local_1b8 != (undefined1  [8])&local_1a8) {
                operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8._M_next)->_M_next + 1));
              }
              if (local_188 != &local_178) {
                operator_delete(local_188,(ulong)((long)&(local_178._M_next)->_M_next + 1));
              }
              if (local_158 != &local_148) {
                operator_delete(local_158,(ulong)((long)&(local_148._M_next)->_M_next + 1));
              }
            }
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
          } while (p_Var12 != (_Rb_tree_node_base *)&pJVar27->type_code);
        }
      }
      else {
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                                *)local_138,&local_100);
        p_Var12 = *(_Rb_tree_node_base **)&local_168[2].type_code;
        pJVar27 = local_168 + 1;
        if (p_Var12 != (_Rb_tree_node_base *)&pJVar27->type_code) {
          _Var1._M_t.
          super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
          super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
               (((pmVar11->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->value)._M_t.
               super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t;
          local_168 = local_168 + 1;
          do {
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSON>_>_>
                                    *)local_168,(key_type *)(p_Var12 + 1));
            this_v_00._M_t.
            super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
            super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl =
                 (((pmVar11->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->value)._M_t.
                 super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>.
                 _M_t;
            local_1b8 = (undefined1  [8])&local_1a8;
            pcVar2 = (local_130->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1b8,pcVar2,pcVar2 + local_130->_M_string_length);
            std::__cxx11::string::append(local_1b8);
            plVar10 = (long *)std::__cxx11::string::_M_append(local_1b8,*(ulong *)(p_Var12 + 1));
            psVar18 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar18) {
              local_78.field_2._M_allocated_capacity = *psVar18;
              local_78.field_2._8_8_ = plVar10[3];
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            }
            else {
              local_78.field_2._M_allocated_capacity = *psVar18;
              local_78._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_78._M_string_length = plVar10[1];
            *plVar10 = (long)psVar18;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            checkSchemaInternal((JSON_value *)
                                this_v_00._M_t.
                                super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                                .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,
                                (JSON_value *)
                                _Var1._M_t.
                                super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>
                                .super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl,
                                local_128,
                                (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_160,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if (local_1b8 != (undefined1  [8])&local_1a8) {
              operator_delete((void *)local_1b8,(ulong)((long)&(local_1a8._M_next)->_M_next + 1));
            }
            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
          } while (p_Var12 != (_Rb_tree_node_base *)&pJVar27->type_code);
        }
      }
      goto LAB_00123159;
    }
    local_1b8 = (undefined1  [8])&local_1a8;
    std::__cxx11::string::_M_construct<char*>((string *)local_1b8,local_120,local_120 + local_118);
    std::__cxx11::string::append(local_1b8);
    p_Var14 = (_List_node_base *)operator_new(0x30);
    p_Var17 = p_Var14 + 2;
    p_Var14[1]._M_next = p_Var17;
    if (local_1b8 == (undefined1  [8])&local_1a8) {
LAB_00122d8a:
      p_Var17->_M_next = local_1a8._M_next;
      p_Var17->_M_prev = local_1a8._M_prev;
    }
    else {
LAB_001227f9:
      p_Var14[1]._M_next = (_List_node_base *)local_1b8;
      p_Var14[2]._M_next = local_1a8._M_next;
    }
    p_Var17 = local_160;
    p_Var14[1]._M_prev = local_1b0;
    local_1b0 = (_List_node_base *)0x0;
    local_1a8._M_next = (_List_node_base *)((ulong)local_1a8._M_next & 0xffffffffffffff00);
    local_1b8 = (undefined1  [8])&local_1a8;
    std::__detail::_List_node_base::_M_hook(p_Var14);
    p_Var17[1]._M_next = (_List_node_base *)((long)&(p_Var17[1]._M_next)->_M_next + 1);
    p_Var22 = (_Base_ptr)local_1a8._M_next;
    auVar23 = local_1b8;
    if (local_1b8 != (undefined1  [8])&local_1a8) {
LAB_001232ec:
      operator_delete((void *)auVar23,(ulong)((long)&p_Var22->_M_color + 1));
    }
LAB_001232f4:
    bVar28 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  return bVar28;
}

Assistant:

bool
JSON::checkSchemaInternal(
    JSON_value* this_v,
    JSON_value* sch_v,
    unsigned long flags,
    std::list<std::string>& errors,
    std::string prefix)
{
    auto* this_arr = dynamic_cast<JSON_array*>(this_v);
    auto* this_dict = dynamic_cast<JSON_dictionary*>(this_v);

    auto* sch_arr = dynamic_cast<JSON_array*>(sch_v);
    auto* sch_dict = dynamic_cast<JSON_dictionary*>(sch_v);

    auto* sch_str = dynamic_cast<JSON_string*>(sch_v);

    std::string err_prefix;
    if (prefix.empty()) {
        err_prefix = "top-level object";
    } else {
        err_prefix = "json key \"" + prefix + "\"";
    }

    std::string pattern_key;
    if (sch_dict) {
        if (!this_dict) {
            QTC::TC("libtests", "JSON wanted dictionary");
            errors.push_back(err_prefix + " is supposed to be a dictionary");
            return false;
        }
        auto members = sch_dict->members;
        std::string key;
        if ((members.size() == 1) &&
            ((key = members.begin()->first, key.length() > 2) && (key.at(0) == '<') &&
             (key.at(key.length() - 1) == '>'))) {
            pattern_key = key;
        }
    }

    if (sch_dict && (!pattern_key.empty())) {
        auto pattern_schema = sch_dict->members[pattern_key].m->value.get();
        for (auto const& iter: this_dict->members) {
            std::string const& key = iter.first;
            checkSchemaInternal(
                this_dict->members[key].m->value.get(),
                pattern_schema,
                flags,
                errors,
                prefix + "." + key);
        }
    } else if (sch_dict) {
        for (auto& iter: sch_dict->members) {
            std::string const& key = iter.first;
            if (this_dict->members.count(key)) {
                checkSchemaInternal(
                    this_dict->members[key].m->value.get(),
                    iter.second.m->value.get(),
                    flags,
                    errors,
                    prefix + "." + key);
            } else {
                if (flags & f_optional) {
                    QTC::TC("libtests", "JSON optional key");
                } else {
                    QTC::TC("libtests", "JSON key missing in object");
                    errors.push_back(
                        err_prefix + ": key \"" + key +
                        "\" is present in schema but missing in object");
                }
            }
        }
        for (auto const& iter: this_dict->members) {
            std::string const& key = iter.first;
            if (sch_dict->members.count(key) == 0) {
                QTC::TC("libtests", "JSON key extra in object");
                errors.push_back(
                    err_prefix + ": key \"" + key +
                    "\" is not present in schema but appears in object");
            }
        }
    } else if (sch_arr) {
        auto n_elements = sch_arr->elements.size();
        if (n_elements == 1) {
            // A single-element array in the schema allows a single element in the object or a
            // variable-length array, each of whose items must conform to the single element of the
            // schema array. This doesn't apply to arrays of arrays -- we fall back to the behavior
            // of allowing a single item only when the object is not an array.
            if (this_arr) {
                int i = 0;
                for (auto const& element: this_arr->elements) {
                    checkSchemaInternal(
                        element.m->value.get(),
                        sch_arr->elements.at(0).m->value.get(),
                        flags,
                        errors,
                        prefix + "." + std::to_string(i));
                    ++i;
                }
            } else {
                QTC::TC("libtests", "JSON schema array for single item");
                checkSchemaInternal(
                    this_v, sch_arr->elements.at(0).m->value.get(), flags, errors, prefix);
            }
        } else if (!this_arr || (this_arr->elements.size() != n_elements)) {
            QTC::TC("libtests", "JSON schema array length mismatch");
            errors.push_back(
                err_prefix + " is supposed to be an array of length " + std::to_string(n_elements));
            return false;
        } else {
            // A multi-element array in the schema must correspond to an element of the same length
            // in the object. Each element in the object is validated against the corresponding
            // element in the schema.
            size_t i = 0;
            for (auto const& element: this_arr->elements) {
                checkSchemaInternal(
                    element.m->value.get(),
                    sch_arr->elements.at(i).m->value.get(),
                    flags,
                    errors,
                    prefix + "." + std::to_string(i));
                ++i;
            }
        }
    } else if (!sch_str) {
        QTC::TC("libtests", "JSON schema other type");
        errors.push_back(err_prefix + " schema value is not dictionary, array, or string");
        return false;
    }

    return errors.empty();
}